

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel(QHttpNetworkConnectionChannel *this)

{
  long in_FS_OFFSET;
  QUrl QStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined ***)this = &PTR_metaObject_002cd580;
  *(undefined4 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x16) = 0;
  QUrl::QUrl(&QStack_28);
  QHttpNetworkRequest::QHttpNetworkRequest
            ((QHttpNetworkRequest *)(this + 0x28),&QStack_28,Get,NormalPriority);
  QUrl::~QUrl(&QStack_28);
  *(undefined4 *)(this + 0x54) = 0;
  this[0x58] = (QHttpNetworkConnectionChannel)0x0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x41) = 0;
  *(undefined8 *)(this + 0x49) = 0;
  *(undefined4 *)(this + 0x5c) = 3;
  QAuthenticator::QAuthenticator((QAuthenticator *)(this + 0x60));
  QAuthenticator::QAuthenticator((QAuthenticator *)(this + 0x68));
  *(undefined2 *)(this + 0x70) = 0;
  *(undefined2 *)(this + 0x88) = 0;
  *(undefined8 *)(this + 0x78) = 0;
  *(undefined8 *)(this + 0x80) = 0;
  *(undefined4 *)(this + 0xb0) = 0;
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  *(undefined8 *)(this + 0xa0) = 0;
  *(undefined8 *)(this + 0xa8) = 0;
  *(undefined8 *)(this + 0xb8) = 0;
  *(undefined8 *)(this + 0xc0) = 0;
  *(undefined8 *)(this + 200) = 0;
  *(undefined8 *)(this + 0xd0) = 0;
  *(undefined8 *)(this + 0xd8) = 0;
  *(undefined8 *)(this + 0xe0) = 0;
  *(undefined4 *)(this + 0xe8) = 2;
  *(undefined8 *)(this + 0xf0) = 0;
  *(undefined8 *)(this + 0xf8) = 0;
  QNetworkProxy::QNetworkProxy((QNetworkProxy *)(this + 0x100));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkConnectionChannel::QHttpNetworkConnectionChannel()
    : socket(nullptr)
    , ssl(false)
    , isInitialized(false)
    , state(IdleState)
    , reply(nullptr)
    , written(0)
    , bytesTotal(0)
    , resendCurrent(false)
    , lastStatus(0)
    , pendingEncrypt(false)
    , reconnectAttempts(reconnectAttemptsDefault)
    , authenticationCredentialsSent(false)
    , proxyCredentialsSent(false)
    , protocolHandler(nullptr)
#ifndef QT_NO_SSL
    , ignoreAllSslErrors(false)
#endif
    , pipeliningSupported(PipeliningSupportUnknown)
    , networkLayerPreference(QAbstractSocket::AnyIPProtocol)
    , connection(nullptr)
{
    // Inlining this function in the header leads to compiler error on
    // release-armv5, on at least timebox 9.2 and 10.1.
}